

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmd_handler.cc
# Opt level: O1

void __thiscall
helix::parity::pmd_handler::process_msg(pmd_handler *this,pmd_order_deleted *m,bool sync)

{
  uint uVar1;
  ulong uVar2;
  order_book *this_00;
  _Hash_node_base *p_Var3;
  undefined8 uVar4;
  _Hash_node_base *__filename;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  uint64_t timestamp;
  event local_60;
  
  uVar2 = m->OrderNumber;
  __filename = (_Hash_node_base *)
               (uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
               uVar2 << 0x38);
  uVar2 = (this->_order_id_map)._M_h._M_bucket_count;
  uVar5 = (ulong)__filename % uVar2;
  p_Var6 = (this->_order_id_map)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var6->_M_nxt, p_Var7 = p_Var6, __filename != p_Var6->_M_nxt[1]._M_nxt)) {
    while (p_Var6 = p_Var3, p_Var3 = p_Var6->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar2 != uVar5) ||
         (p_Var7 = p_Var6, __filename == p_Var3[1]._M_nxt)) goto LAB_001194aa;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_001194aa:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var7->_M_nxt;
  }
  if (p_Var3 != (_Hash_node_base *)0x0) {
    this_00 = (order_book *)p_Var3[2]._M_nxt;
    uVar1 = m->Timestamp;
    timestamp = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                       uVar1 << 0x18) / 1000000 + (ulong)(this->_seconds * 1000);
    order_book::remove(this_00,(char *)__filename);
    this_00->_timestamp = timestamp;
    if (sync) {
      make_ob_event(&local_60,(string *)this_00,timestamp,this_00,0);
      if ((this->_process_event).super__Function_base._M_manager == (_Manager_type)0x0) {
        uVar4 = std::__throw_bad_function_call();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._symbol._M_dataplus._M_p != &local_60._symbol.field_2) {
          operator_delete(local_60._symbol._M_dataplus._M_p,
                          local_60._symbol.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar4);
      }
      (*(this->_process_event)._M_invoker)((_Any_data *)this,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._symbol._M_dataplus._M_p != &local_60._symbol.field_2) {
        operator_delete(local_60._symbol._M_dataplus._M_p,
                        local_60._symbol.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void pmd_handler::process_msg(const pmd_order_deleted* m, bool sync)
{
    uint64_t order_id = be64toh(m->OrderNumber);
    auto it = _order_id_map.find(order_id);
    if (it != _order_id_map.end()) {
        auto& ob = it->second;
        uint64_t timestamp = to_timestamp(be32toh(m->Timestamp));
        ob.remove(order_id);
        ob.set_timestamp(timestamp);
        if (sync) {
            _process_event(make_ob_event(ob.symbol(), timestamp, &ob));
        }
    }
}